

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveNonJSOps.cpp
# Opt level: O1

void __thiscall wasm::RemoveNonJSOpsPass::rewriteCopysign(RemoveNonJSOpsPass *this,Binary *curr)

{
  Expression *pEVar1;
  Builder *pBVar2;
  Builder *this_00;
  Unary *pUVar3;
  Const *pCVar4;
  Binary *this_01;
  Binary *this_02;
  Binary *this_03;
  Literal local_d8;
  Literal local_c0;
  undefined1 auStack_a8 [8];
  Literal signBit;
  undefined1 auStack_88 [8];
  Literal otherBits;
  anon_union_16_6_1532cd5a_for_Literal_0 local_68;
  undefined8 local_58;
  Builder *local_50;
  BinaryOp local_48;
  UnaryOp local_44;
  RemoveNonJSOpsPass *local_40;
  UnaryOp local_38;
  BinaryOp local_34;
  
  auStack_a8 = (undefined1  [8])0x0;
  signBit.field_0.i64 = 0;
  signBit.field_0.func.super_IString.str._M_str = (char *)0x0;
  otherBits.field_0.func.super_IString.str._M_str = (char *)0x0;
  auStack_88 = (undefined1  [8])0x0;
  otherBits.field_0.i64 = 0;
  local_40 = this;
  if (curr->op == CopySignFloat64) {
    local_68.i64 = -0x8000000000000000;
    local_58 = 3;
    Literal::operator=((Literal *)auStack_a8,(Literal *)&local_68.func);
    Literal::~Literal((Literal *)&local_68.func);
    local_68.i64 = 0x7fffffffffffffff;
    local_58 = 3;
    Literal::operator=((Literal *)auStack_88,(Literal *)&local_68.func);
    Literal::~Literal((Literal *)&local_68.func);
    local_48 = OrInt64;
    local_34 = AndInt64;
    local_38 = ReinterpretFloat64;
    local_44 = ReinterpretInt64;
  }
  else {
    if (curr->op != CopySignFloat32) goto LAB_00a8baa6;
    local_68.i32 = -0x80000000;
    local_58 = 2;
    Literal::operator=((Literal *)auStack_a8,(Literal *)&local_68.func);
    Literal::~Literal((Literal *)&local_68.func);
    local_68.i32 = 0x7fffffff;
    local_58 = 2;
    Literal::operator=((Literal *)auStack_88,(Literal *)&local_68.func);
    Literal::~Literal((Literal *)&local_68.func);
    local_48 = OrInt32;
    local_34 = AndInt32;
    local_38 = ReinterpretFloat32;
    local_44 = ReinterpretInt32;
  }
  local_50 = (local_40->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  pEVar1 = curr->left;
  pUVar3 = (Unary *)MixedArena::allocSpace(&local_50->wasm->allocator,0x20,8);
  (pUVar3->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
  (pUVar3->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
  pUVar3->op = local_38;
  pUVar3->value = pEVar1;
  Unary::finalize(pUVar3);
  pBVar2 = (local_40->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  Literal::Literal(&local_d8,(Literal *)auStack_88);
  pCVar4 = Builder::makeConst(pBVar2,&local_d8);
  this_01 = (Binary *)MixedArena::allocSpace(&local_50->wasm->allocator,0x28,8);
  (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  this_01->op = local_34;
  this_01->left = (Expression *)pUVar3;
  this_01->right = (Expression *)pCVar4;
  Binary::finalize(this_01);
  pBVar2 = (local_40->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  pEVar1 = curr->right;
  pUVar3 = (Unary *)MixedArena::allocSpace(&pBVar2->wasm->allocator,0x20,8);
  (pUVar3->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
  (pUVar3->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
  pUVar3->op = local_38;
  pUVar3->value = pEVar1;
  Unary::finalize(pUVar3);
  this_00 = (local_40->builder)._M_t.
            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
            super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  Literal::Literal(&local_c0,(Literal *)auStack_a8);
  pCVar4 = Builder::makeConst(this_00,&local_c0);
  this_02 = (Binary *)MixedArena::allocSpace(&pBVar2->wasm->allocator,0x28,8);
  (this_02->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (this_02->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  this_02->op = local_34;
  this_02->left = (Expression *)pUVar3;
  this_02->right = (Expression *)pCVar4;
  Binary::finalize(this_02);
  this_03 = (Binary *)MixedArena::allocSpace(&local_50->wasm->allocator,0x28,8);
  (this_03->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (this_03->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  this_03->op = local_48;
  this_03->left = (Expression *)this_01;
  this_03->right = (Expression *)this_02;
  Binary::finalize(this_03);
  pUVar3 = (Unary *)MixedArena::allocSpace(&local_50->wasm->allocator,0x20,8);
  (pUVar3->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
  (pUVar3->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
  pUVar3->op = local_44;
  pUVar3->value = (Expression *)this_03;
  Unary::finalize(pUVar3);
  Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>::replaceCurrent
            (&(local_40->
              super_WalkerPass<wasm::PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>_>
              ).
              super_PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
              .
              super_Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
             ,(Expression *)pUVar3);
  Literal::~Literal(&local_c0);
  Literal::~Literal(&local_d8);
LAB_00a8baa6:
  Literal::~Literal((Literal *)auStack_88);
  Literal::~Literal((Literal *)auStack_a8);
  return;
}

Assistant:

void rewriteCopysign(Binary* curr) {

    // i32.copysign(x, y)   =>   f32.reinterpret(
    //   (i32.reinterpret(x) & ~(1 << 31)) |
    //   (i32.reinterpret(y) &  (1 << 31)
    // )
    //
    // i64.copysign(x, y)   =>   f64.reinterpret(
    //   (i64.reinterpret(x) & ~(1 << 63)) |
    //   (i64.reinterpret(y) &  (1 << 63)
    // )

    Literal signBit, otherBits;
    UnaryOp int2float, float2int;
    BinaryOp bitAnd, bitOr;

    switch (curr->op) {
      case CopySignFloat32:
        float2int = ReinterpretFloat32;
        int2float = ReinterpretInt32;
        bitAnd = AndInt32;
        bitOr = OrInt32;
        signBit = Literal(uint32_t(1U << 31));
        otherBits = Literal(~uint32_t(1U << 31));
        break;

      case CopySignFloat64:
        float2int = ReinterpretFloat64;
        int2float = ReinterpretInt64;
        bitAnd = AndInt64;
        bitOr = OrInt64;
        signBit = Literal(uint64_t(1ULL << 63));
        otherBits = Literal(~uint64_t(1ULL << 63));
        break;

      default:
        return;
    }

    replaceCurrent(builder->makeUnary(
      int2float,
      builder->makeBinary(
        bitOr,
        builder->makeBinary(bitAnd,
                            builder->makeUnary(float2int, curr->left),
                            builder->makeConst(otherBits)),
        builder->makeBinary(bitAnd,
                            builder->makeUnary(float2int, curr->right),
                            builder->makeConst(signBit)))));
  }